

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_t.cpp
# Opt level: O0

void __thiscall deci::stack_t::~stack_t(stack_t *this)

{
  size_t sVar1;
  stack_t *this_local;
  
  (*this->result->_vptr_value_t[3])();
  sVar1 = Depth(this);
  Drop(this,(int)sVar1);
  dictionary_t::~dictionary_t(&this->context);
  std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>::~vector(&this->storage);
  return;
}

Assistant:

stack_t::~stack_t() {
    this->result->Delete();
    this->Drop(this->Depth());
  }